

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O0

fdb_status wal_discard(filemgr *file,fdb_txn *txn)

{
  byte bVar1;
  uint32_t uVar2;
  list_elem *plVar3;
  __atomic_base<unsigned_char> *this;
  long in_RSI;
  avl_node *in_RDI;
  uint64_t mem_overhead;
  size_t seq_shard_num;
  size_t shard_num;
  list_elem *e;
  wal_item *item;
  bid_t in_stack_00000038;
  filemgr *in_stack_00000040;
  size_t buf_len;
  atomic<unsigned_long> *in_stack_ffffffffffffffd0;
  list_elem *local_20;
  
  buf_len = 0;
  local_20 = list_begin(*(list **)(in_RSI + 0x20));
  do {
    if (local_20 == (list_elem *)0x0) {
      atomic_sub_uint64_t(in_stack_ffffffffffffffd0,buf_len,memory_order_relaxed);
      return FDB_RESULT_SUCCESS;
    }
    uVar2 = get_checksum((uint8_t *)in_stack_ffffffffffffffd0,buf_len);
    this = (__atomic_base<unsigned_char> *)((ulong)uVar2 % (ulong)in_RDI[3].parent[3].parent);
    pthread_spin_lock((pthread_spinlock_t *)&in_RDI[3].parent[2].left[(long)this].right);
    if (*(char *)((long)&(in_RDI[0xb].left)->right + 1) == '\x01') {
      in_stack_ffffffffffffffd0 =
           (atomic<unsigned_long> *)((ulong)local_20[-1].prev % (ulong)in_RDI[3].parent[3].parent);
      pthread_spin_lock((pthread_spinlock_t *)
                        &in_RDI[3].parent[2].right[(long)in_stack_ffffffffffffffd0].right);
      avl_remove((avl_tree *)mem_overhead,in_RDI);
      pthread_spin_unlock((pthread_spinlock_t *)
                          &in_RDI[3].parent[2].right[(long)in_stack_ffffffffffffffd0].right);
    }
    list_remove((list *)&local_20[-4].prev[2].next,(list_elem *)&local_20[-7].next);
    plVar3 = list_begin((list *)&local_20[-4].prev[2].next);
    if (plVar3 == (list_elem *)0x0) {
      avl_remove((avl_tree *)mem_overhead,in_RDI);
      buf_len = (ulong)*(ushort *)&local_20[-4].prev[2].prev + 0x38 + buf_len;
      free(local_20[-4].prev[1].next);
      free(local_20[-4].prev);
    }
    plVar3 = list_remove(*(list **)(in_RSI + 0x20),local_20);
    if ((avl_node *)local_20[-3].prev == in_RDI[0xd].parent) {
LAB_001957f1:
      atomic_decr_uint32_t
                ((atomic<unsigned_int> *)in_stack_ffffffffffffffd0,(memory_order)(buf_len >> 0x20));
    }
    else {
      bVar1 = std::__atomic_base::operator_cast_to_unsigned_char(this);
      if ((bVar1 & 1) != 0) goto LAB_001957f1;
    }
    if (*(char *)&local_20[-2].prev != '\x02') {
      atomic_sub_uint64_t(in_stack_ffffffffffffffd0,buf_len,memory_order_relaxed);
      filemgr_mark_stale(in_stack_00000040,in_stack_00000038,(size_t)file);
    }
    free(&local_20[-7].next);
    atomic_decr_uint32_t
              ((atomic<unsigned_int> *)in_stack_ffffffffffffffd0,(memory_order)(buf_len >> 0x20));
    buf_len = buf_len + 0x80;
    pthread_spin_unlock((pthread_spinlock_t *)&in_RDI[3].parent[2].left[(long)this].right);
    local_20 = plVar3;
  } while( true );
}

Assistant:

fdb_status wal_discard(struct filemgr *file, fdb_txn *txn)
{
    struct wal_item *item;
    struct list_elem *e;
    size_t shard_num, seq_shard_num;
    uint64_t mem_overhead = 0;

    e = list_begin(txn->items);
    while(e) {
        item = _get_entry(e, struct wal_item, list_elem_txn);
        shard_num = get_checksum((uint8_t*)item->header->key,
                                 item->header->keylen) %
                                 file->wal->num_shards;
        spin_lock(&file->wal->key_shards[shard_num].lock);

        if (file->config->seqtree_opt == FDB_SEQTREE_USE) {
            // remove from seq map
            seq_shard_num = item->seqnum % file->wal->num_shards;
            spin_lock(&file->wal->seq_shards[seq_shard_num].lock);
            avl_remove(&file->wal->seq_shards[seq_shard_num]._map,
                       &item->avl_seq);
            spin_unlock(&file->wal->seq_shards[seq_shard_num].lock);
        }

        // remove from header's list
        list_remove(&item->header->items, &item->list_elem);
        // remove header if empty
        if (list_begin(&item->header->items) == NULL) {
            //remove from key map
            avl_remove(&file->wal->key_shards[shard_num]._map,
                       &item->header->avl_key);
            mem_overhead += sizeof(struct wal_item_header) + item->header->keylen;
            // free key and header
            free(item->header->key);
            free(item->header);
        }
        // remove from txn's list
        e = list_remove(txn->items, e);
        if (item->txn_id == file->global_txn.txn_id ||
            item->flag & WAL_ITEM_COMMITTED) {
            atomic_decr_uint32_t(&file->wal->num_flushable);
        }
        if (item->action != WAL_ACT_REMOVE) {
            atomic_sub_uint64_t(&file->wal->datasize, item->doc_size,
                                std::memory_order_relaxed);
            // mark as stale if the item is not an immediate remove
            filemgr_mark_stale(file, item->offset, item->doc_size);
        }

        // free
        free(item);
        atomic_decr_uint32_t(&file->wal->size);
        mem_overhead += sizeof(struct wal_item);
        spin_unlock(&file->wal->key_shards[shard_num].lock);
    }
    atomic_sub_uint64_t(&file->wal->mem_overhead, mem_overhead,
                        std::memory_order_relaxed);

    return FDB_RESULT_SUCCESS;
}